

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::detail::Beta_I<float>(float x,float p,float q,float norm)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if ((((1.0 < x) || (x < 0.0)) || (p <= 0.0)) || (q <= 0.0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    fVar7 = NAN;
  }
  else {
    fVar12 = p + q;
    fVar5 = fVar12 * x;
    fVar7 = q;
    fVar6 = 1.0 - x;
    fVar14 = p;
    if (p < fVar5) {
      fVar7 = p;
      fVar6 = x;
      fVar14 = q;
      x = 1.0 - x;
    }
    iVar1 = (int)(fVar6 * fVar12 + fVar7);
    fVar9 = x;
    if (iVar1 != 0) {
      fVar9 = x / fVar6;
    }
    fVar11 = 1.0;
    fVar10 = 1.0;
    fVar8 = 1.0;
    fVar13 = fVar7 + -1.0;
    while( true ) {
      fVar11 = ((fVar13 * fVar9) / (fVar14 + fVar10)) * fVar11;
      fVar8 = fVar8 + fVar11;
      if ((ABS(fVar11) <= 4.7683716e-07) && (ABS(fVar11) <= fVar8 * 4.7683716e-07)) break;
      fVar10 = fVar10 + 1.0;
      iVar2 = iVar1 + -1;
      if (iVar1 < 1) {
        fVar13 = fVar12;
        iVar1 = iVar2;
        fVar12 = fVar12 + 1.0;
      }
      else {
        fVar13 = fVar7 - fVar10;
        iVar1 = iVar2;
        if (iVar2 == 0) {
          fVar9 = x;
        }
      }
    }
    fVar12 = logf(x);
    fVar6 = logf(fVar6);
    fVar7 = expf(fVar6 * (fVar7 + -1.0) + fVar12 * fVar14);
    fVar8 = fVar8 * ((fVar7 / fVar14) / norm);
    uVar4 = -(uint)(p < fVar5);
    fVar7 = (float)(uVar4 & (uint)(1.0 - fVar8) | ~uVar4 & (uint)fVar8);
  }
  return fVar7;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }